

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ZSTD_bufferMode_e ZVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  
  sVar6 = 0xffffffffffffffba;
  if (output->pos <= output->size) {
    uVar1 = input->size;
    uVar2 = input->pos;
    sVar6 = 0xffffffffffffffb8;
    if ((uVar2 <= uVar1) && (sVar6 = 0xffffffffffffffd6, endOp < (ZSTD_e_end|ZSTD_e_flush))) {
      if (cctx == (ZSTD_CCtx *)0x0) {
        __assert_fail("cctx != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x68fc,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      if (cctx->streamStage == zcss_init) {
        sVar6 = (uVar1 - uVar2) + cctx->stableIn_notConsumed;
        if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable))
           && (sVar6 < 0x20000)) {
          if (cctx->stableIn_notConsumed != 0) {
            if (input->src != (cctx->expectedInBuffer).src) {
              return 0xffffffffffffffce;
            }
            if (uVar2 != (cctx->expectedInBuffer).size) {
              return 0xffffffffffffffce;
            }
          }
          input->pos = uVar1;
          (cctx->expectedInBuffer).pos = uVar1;
          sVar7 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar7;
          cctx->stableIn_notConsumed = sVar6;
          return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
        }
        sVar6 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar6);
        if (0xffffffffffffff88 < sVar6) {
          return sVar6;
        }
        ZVar5 = (cctx->appliedParams).inBufferMode;
        if (ZVar5 == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          sVar6 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar6;
        }
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
      else {
        ZVar5 = (cctx->appliedParams).inBufferMode;
      }
      if (((ZVar5 != ZSTD_bm_stable) ||
          ((sVar6 = 0xffffffffffffffce, (cctx->expectedInBuffer).src == input->src &&
           ((cctx->expectedInBuffer).pos == input->pos)))) &&
         (((cctx->appliedParams).outBufferMode != ZSTD_bm_stable ||
          (sVar6 = 0xffffffffffffffce, cctx->expectedOutBufferSize == output->size - output->pos))))
      {
        if ((cctx->appliedParams).nbWorkers < 1) {
          sVar6 = ZSTD_compressStream_generic(cctx,output,input,endOp);
          if (sVar6 < 0xffffffffffffff89) {
            if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
              (cctx->expectedInBuffer).pos = input->pos;
              sVar6 = input->size;
              (cctx->expectedInBuffer).src = input->src;
              (cctx->expectedInBuffer).size = sVar6;
            }
            if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
              cctx->expectedOutBufferSize = output->size - output->pos;
            }
            sVar6 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
          }
        }
        else {
          if (cctx->cParamsChanged != 0) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx,&cctx->requestedParams);
            cctx->cParamsChanged = 0;
          }
          uVar1 = cctx->stableIn_notConsumed;
          if (uVar1 == 0) {
            sVar7 = input->pos;
          }
          else {
            if ((cctx->appliedParams).inBufferMode != ZSTD_bm_stable) {
              __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_stable",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6922,
                            "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                           );
            }
            sVar7 = input->pos - uVar1;
            if (input->pos < uVar1) {
              __assert_fail("input->pos >= cctx->stableIn_notConsumed",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6924,
                            "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                           );
            }
            input->pos = sVar7;
            cctx->stableIn_notConsumed = 0;
          }
          sVar8 = output->pos;
          while( true ) {
            sVar6 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
            sVar3 = input->pos;
            cctx->consumedSrcSize = cctx->consumedSrcSize + (sVar3 - sVar7);
            sVar4 = output->pos;
            cctx->producedCSize = cctx->producedCSize + (sVar4 - sVar8);
            if (0xffffffffffffff88 < sVar6) {
              cctx->streamStage = zcss_init;
              cctx->pledgedSrcSizePlusOne = 0;
              return sVar6;
            }
            if (sVar6 == 0 && endOp == ZSTD_e_end) break;
            if (endOp == ZSTD_e_continue) {
              if (((sVar3 != sVar7) || (sVar4 != sVar8)) ||
                 ((sVar7 == input->size ||
                  (bVar9 = sVar8 == output->size, sVar7 = sVar3, sVar8 = sVar4, bVar9))))
              goto LAB_0016cac0;
            }
            else if ((sVar6 == 0) || (sVar7 = sVar3, sVar8 = sVar4, sVar4 == output->size))
            goto LAB_0016cac0;
          }
          cctx->streamStage = zcss_init;
          cctx->pledgedSrcSizePlusOne = 0;
LAB_0016cac0:
          if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
            (cctx->expectedInBuffer).pos = input->pos;
            sVar7 = input->size;
            (cctx->expectedInBuffer).src = input->src;
            (cctx->expectedInBuffer).size = sVar7;
          }
          if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
            cctx->expectedOutBufferSize = output->size - output->pos;
          }
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}